

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction::~IfcStructuralPlanarAction
          (IfcStructuralPlanarAction *this)

{
  undefined1 *puVar1;
  IfcStructuralActivity *this_00;
  long *plVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.
                              super_IfcProduct.super_IfcObject + -0x18);
  this_00 = (IfcStructuralActivity *)
            (&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
              super_IfcObject.field_0x0 + lVar3);
  plVar2 = (long *)(&this->field_0x198 + lVar3);
  plVar2[-0x33] = 0x896888;
  plVar2[2] = 0x8969a0;
  plVar2[-0x22] = 0x8968b0;
  plVar2[-0x20] = 0x8968d8;
  plVar2[-0x19] = 0x896900;
  plVar2[-0x13] = 0x896928;
  plVar2[-0xc] = 0x896950;
  plVar2[-4] = 0x896978;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject = 0x896b50;
  *(undefined8 *)&this_00[1].super_IfcProduct.super_IfcObject.field_0x58 = 0x896c40;
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject.field_0x88 = 0x896b78;
  (this_00->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x896ba0;
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject.field_0xd0 = 0x896bc8;
  *(undefined8 *)&(this_00->super_IfcProduct).field_0x100 = 0x896bf0;
  *(undefined8 *)&this_00->field_0x138 = 0x896c18;
  puVar1 = &this_00[1].super_IfcProduct.super_IfcObject.field_0x8;
  if (*(undefined1 **)&this_00->field_0x148 != puVar1) {
    operator_delete(*(undefined1 **)&this_00->field_0x148,*(long *)puVar1 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity(this_00,&PTR_construction_vtable_24__008969c0);
  return;
}

Assistant:

IfcStructuralPlanarAction() : Object("IfcStructuralPlanarAction") {}